

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall
GGSock::Communicator::setMessageCallback(Communicator *this,TMessageType type,CBMessage *callback)

{
  Data *this_00;
  key_type *in_RDI;
  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  *unaff_retaddr;
  lock_guard<std::mutex> lock;
  Data *data;
  mutex_type *in_stack_ffffffffffffffb8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffc0;
  function<unsigned_short_(const_char_*,_unsigned_int)> *in_stack_ffffffffffffffd8;
  
  this_00 = getData((Communicator *)0x12d9c0);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
  ::operator[](unaff_retaddr,in_RDI);
  std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator=
            ((function<unsigned_short_(const_char_*,_unsigned_int)> *)this_00,
             in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12da19);
  return true;
}

Assistant:

bool Communicator::setMessageCallback(TMessageType type, CBMessage && callback) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        data.messageCallback[type] = std::move(callback);

        return true;
    }